

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

double __thiscall AmpIO::ReadWatchdogPeriodInSeconds(AmpIO *this)

{
  BasePort *pBVar1;
  double dVar2;
  uint32_t counts;
  uint local_c;
  
  local_c = 0;
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  if (pBVar1 == (BasePort *)0x0) {
    dVar2 = 0.0;
  }
  else {
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,3,&local_c);
    dVar2 = (double)(local_c & 0xffff) * 5.208333333333333e-06;
  }
  return dVar2;
}

Assistant:

double AmpIO::ReadWatchdogPeriodInSeconds(void) const
{
    return ReadWatchdogPeriod()*WDOG_ClockPeriod;
}